

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvapeekstat.c
# Opt level: O0

int main(int argc,char **argv)

{
  long lVar1;
  uint *__base;
  int32_t addr;
  int32_t card;
  int iVar2;
  uint32_t uVar3;
  ulong uVar4;
  size_t __nmemb;
  ulong uVar5;
  undefined8 uStack_60;
  uint auStack_58 [2];
  uint *local_50;
  uint local_48;
  uint local_44;
  int cnt;
  uint32_t prev;
  unsigned_long __vla_expr0;
  int local_2c;
  uint local_28;
  int32_t i;
  int32_t b;
  int32_t a;
  int cnum;
  int c;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  uStack_60 = 0x10127d;
  _cnum = argv;
  argv_local._0_4_ = argc;
  iVar2 = nva_init();
  if (iVar2 == 0) {
    b = 0;
    while( true ) {
      uStack_60 = 0x1012c0;
      a = getopt((int)argv_local,_cnum,"c:");
      if (a == -1) break;
      if (a == 99) {
        uStack_60 = 0x1012ee;
        __isoc99_sscanf(_optarg,"%d",&b);
      }
    }
    if (b < nva_cardsnum) {
      local_28 = 10000;
      if (_optind < (int)argv_local) {
        uStack_60 = 0x1013a5;
        __isoc99_sscanf(_cnum[_optind],"%x",&i);
        if (_optind + 1 < (int)argv_local) {
          uStack_60 = 0x1013df;
          __isoc99_sscanf(_cnum[_optind + 1],"%d",&local_28);
        }
        _cnt = (ulong)local_28;
        lVar1 = -(_cnt * 4 + 0xf & 0xfffffffffffffff0);
        local_50 = (uint *)((long)auStack_58 + lVar1);
        __vla_expr0 = (unsigned_long)auStack_58;
        for (local_2c = 0; card = b, addr = i, __base = local_50, local_2c < (int)local_28;
            local_2c = local_2c + 1) {
          *(undefined8 *)((long)auStack_58 + lVar1 + -8) = 0x101420;
          uVar3 = nva_rd32(card,addr);
          local_50[local_2c] = uVar3;
        }
        __nmemb = (size_t)(int)local_28;
        *(undefined8 *)((long)auStack_58 + lVar1 + -8) = 0x101451;
        qsort(__base,__nmemb,4,cmp);
        local_44 = *local_50;
        local_48 = 0;
        for (local_2c = 0; local_2c < (int)local_28; local_2c = local_2c + 1) {
          if (local_50[local_2c] != local_44) {
            uVar5 = (ulong)local_44;
            uVar4 = (ulong)local_48;
            *(undefined8 *)((long)auStack_58 + lVar1 + -8) = 0x101494;
            printf("%08x: %d\n",uVar5,uVar4);
            local_48 = 0;
            local_44 = local_50[local_2c];
          }
          local_48 = local_48 + 1;
        }
        uVar5 = (ulong)local_44;
        uVar4 = (ulong)local_48;
        *(undefined8 *)((long)auStack_58 + lVar1 + -8) = 0x1014d1;
        printf("%08x: %d\n",uVar5,uVar4);
        argv_local._4_4_ = 0;
      }
      else {
        uStack_60 = 0x101375;
        fprintf(_stderr,"No address specified.\n");
        argv_local._4_4_ = 1;
      }
    }
    else {
      if (nva_cardsnum == 0) {
        uStack_60 = 0x10133c;
        fprintf(_stderr,"No cards found.\n");
      }
      else {
        uStack_60 = 0x101322;
        fprintf(_stderr,"No such card.\n");
      }
      argv_local._4_4_ = 1;
    }
  }
  else {
    uStack_60 = 0x10129a;
    fprintf(_stderr,"PCI init failure!\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 10000, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%d", &b);
	uint32_t tab[b];
	for (i = 0; i < b; i++)
		tab[i] = nva_rd32(cnum, a);
	qsort(tab, b, sizeof *tab, cmp);
	uint32_t prev = tab[0];
	int cnt = 0;
	for (i = 0; i < b; i++) {
		if (tab[i] != prev) {
			printf("%08x: %d\n", prev, cnt);
			cnt = 0;
			prev = tab[i];
		}
		cnt++;
	}
	printf("%08x: %d\n", prev, cnt);
	return 0;
}